

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_ironlich.cpp
# Opt level: O3

int AF_A_LichFireGrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int *piVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClass *pPVar6;
  FState *newstate;
  uint uVar7;
  AActor *this;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FName local_2c;
  undefined4 extraout_var_00;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005cf23f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (AActor *)0x0) {
LAB_005cf0eb:
        this = (AActor *)0x0;
        pVVar8 = param;
        uVar7 = numparam;
      }
      else {
        pPVar5 = (this->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (this->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar5 == pPVar6;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar6) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar7 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cf23f;
        }
      }
      pPVar6 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005cf1ab;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_005cf22f;
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar3[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar8,uVar7,ret);
              puVar3[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar6 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar6) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005cf23f;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_005cf22f;
      }
      if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005cf1ab:
        piVar1 = &this->health;
        *piVar1 = *piVar1 + -1;
        iVar4 = *piVar1;
        (this->__Pos).Z = (this->__Pos).Z + 9.0;
        if (iVar4 == 0) {
          pPVar6 = (this->super_DThinker).super_DObject.Class;
          if (pPVar6 == (PClass *)0x0) {
            iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
            pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar4);
            (this->super_DThinker).super_DObject.Class = pPVar6;
          }
          this->Damage = *(VMFunction **)(pPVar6->Defaults + 0x180);
          local_2c.Index = FName::NameManager::FindName(&FName::NameData,"NoGrow",false);
          newstate = AActor::FindState(this,&local_2c);
          AActor::SetState(this,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005cf23f;
    }
    if (this == (AActor *)0x0) goto LAB_005cf0eb;
  }
LAB_005cf22f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005cf23f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                ,0xca,"int AF_A_LichFireGrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LichFireGrow)
{
	PARAM_ACTION_PROLOGUE;

	self->health--;
	self->AddZ(9.);
	if (self->health == 0)
	{
		self->Damage = self->GetDefault()->Damage;
		self->SetState (self->FindState("NoGrow"));
	}
	return 0;
}